

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::ScanNewImplicitRoots(HeapInfo *this)

{
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  HeapInfo *this_local;
  
  for (local_14 = 0; local_14 < 0x30; local_14 = local_14 + 1) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (this->heapBuckets + local_14,this->recycler);
  }
  for (local_18 = 0; local_18 < 0x1d; local_18 = local_18 + 1) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (this->mediumHeapBuckets + local_18,this->recycler);
  }
  LargeHeapBucket::ScanNewImplicitRoots(&this->largeObjectBucket,this->recycler);
  HeapBlockList::
  ForEach<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::ScanNewImplicitRoots()::__0>
            (this->newLeafHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::ScanNewImplicitRoots()::__1>
            (this->newNormalHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::ScanNewImplicitRoots()::__2>
            (this->newNormalWithBarrierHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::ScanNewImplicitRoots()::__3>
            (this->newFinalizableWithBarrierHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::ScanNewImplicitRoots()::__4>
            (this->newFinalizableHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::ScanNewImplicitRoots()::__5>
            (this->newMediumLeafHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::ScanNewImplicitRoots()::__6>
            (this->newMediumNormalHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::ScanNewImplicitRoots()::__7>
            (this->newMediumNormalWithBarrierHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::ScanNewImplicitRoots()::__8>
            (this->newMediumFinalizableWithBarrierHeapBlockList,(anon_class_8_1_8991fb9c)this);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::ScanNewImplicitRoots()::__9>
            (this->newMediumFinalizableHeapBlockList,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void
HeapInfo::ScanNewImplicitRoots()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].ScanNewImplicitRoots(recycler);
    }
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].ScanNewImplicitRoots(recycler);
    }
#endif

    largeObjectBucket.ScanNewImplicitRoots(recycler);

#if ENABLE_CONCURRENT_GC

    // NOTE: need to do newLeafHeapBlockList to find new memory
    HeapBlockList::ForEach(newLeafHeapBlockList, [this](SmallLeafHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newNormalHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [this](SmallNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [this](SmallFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newFinalizableHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    // NOTE: need to do newLeafHeapBlockList to find new memory
    HeapBlockList::ForEach(newMediumLeafHeapBlockList, [this](MediumLeafHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumNormalHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [this](MediumNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [this](MediumFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#endif
}